

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86compiler.cpp
# Opt level: O2

Error __thiscall
asmjit::X86Compiler::_emit
          (X86Compiler *this,uint32_t instId,Operand_ *o0,Operand_ *o1,Operand_ *o2,Operand_ *o3,
          Operand_ *o4,Operand_ *o5)

{
  ZoneHeap *this_00;
  CBNode **ppCVar1;
  uint32_t uVar2;
  Zone *pZVar3;
  ushort uVar4;
  anon_union_8_2_78723da6_for_MemData_2 aVar5;
  ushort uVar6;
  uint uVar7;
  Error EVar8;
  int iVar9;
  CBNode *node;
  void **ppvVar10;
  undefined4 extraout_var;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  CBNode **ppCVar14;
  uint uVar15;
  Detail instDetail;
  StringBuilderTmp<256UL> sb;
  Operand opArray [6];
  
  pcVar11 = (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._inlineComment;
  uVar15 = (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._globalOptions |
           (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._options;
  uVar7 = 5;
  if ((undefined1  [16])((undefined1  [16])o4->field_0 & (undefined1  [16])0x7) ==
      (undefined1  [16])0x0) {
    uVar7 = ((((uint)((undefined1  [16])((undefined1  [16])o1->field_0 & (undefined1  [16])0x7) !=
                     (undefined1  [16])0x0) -
              (uint)((undefined1  [16])((undefined1  [16])o0->field_0 & (undefined1  [16])0x7) ==
                    (undefined1  [16])0x0)) -
             (uint)((undefined1  [16])((undefined1  [16])o2->field_0 & (undefined1  [16])0x7) ==
                   (undefined1  [16])0x0)) + 3) -
            (uint)((undefined1  [16])((undefined1  [16])o3->field_0 & (undefined1  [16])0x7) ==
                  (undefined1  [16])0x0);
  }
  uVar13 = 6;
  if ((undefined1  [16])((undefined1  [16])o5->field_0 & (undefined1  [16])0x7) ==
      (undefined1  [16])0x0) {
    uVar13 = (ulong)uVar7;
  }
  uVar7 = (uint)uVar13;
  if ((uVar15 & 3) != 0) {
    EVar8 = (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._lastError;
    if (EVar8 != 0) {
      return EVar8;
    }
    if ((uVar15 & 2) != 0) {
      opArray[0].super_Operand_.field_0._0_8_ = (o0->field_0)._packed[0];
      opArray[0].super_Operand_.field_0._8_8_ = (o0->field_0)._mem.field_2;
      opArray[1].super_Operand_.field_0._0_8_ = (o1->field_0)._packed[0];
      opArray[1].super_Operand_.field_0._8_8_ = (o1->field_0)._mem.field_2;
      opArray[2].super_Operand_.field_0._0_8_ = (o2->field_0)._packed[0];
      opArray[2].super_Operand_.field_0._8_8_ = (o2->field_0)._mem.field_2;
      opArray[3].super_Operand_.field_0._0_8_ = (o3->field_0)._packed[0];
      opArray[3].super_Operand_.field_0._8_8_ = (o3->field_0)._mem.field_2;
      opArray[4].super_Operand_.field_0._0_8_ = (o4->field_0)._packed[0];
      opArray[4].super_Operand_.field_0._8_8_ = (o4->field_0)._mem.field_2;
      opArray[5].super_Operand_.field_0._0_8_ = (o5->field_0)._packed[0];
      opArray[5].super_Operand_.field_0._8_8_ = (o5->field_0)._mem.field_2;
      instDetail.extraReg = (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg
      ;
      instDetail.instId = instId;
      instDetail.options = uVar15;
      EVar8 = Inst::validate((uint)(this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter.
                                   _codeInfo._archInfo.field_0.field_0._type,&instDetail,
                             &opArray[0].super_Operand_,uVar7);
      if (EVar8 != 0) {
        sb.super_StringBuilder._data = sb._embeddedData;
        sb._embeddedData[0] = '\0';
        sb.super_StringBuilder._length = 0;
        sb.super_StringBuilder._capacity = 0x100;
        sb.super_StringBuilder._canFree = 0;
        pcVar11 = DebugUtils::errorAsString(EVar8);
        StringBuilder::_opString(&sb.super_StringBuilder,1,pcVar11,0xffffffffffffffff);
        StringBuilder::_opString(&sb.super_StringBuilder,1,": ",0xffffffffffffffff);
        Logging::formatInstruction
                  (&sb.super_StringBuilder,0,(CodeEmitter *)this,
                   (uint)(this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._codeInfo.
                         _archInfo.field_0.field_0._type,&instDetail,&opArray[0].super_Operand_,
                   uVar7);
        EVar8 = CodeEmitter::setLastError((CodeEmitter *)this,EVar8,sb.super_StringBuilder._data);
        StringBuilder::~StringBuilder(&sb.super_StringBuilder);
        return EVar8;
      }
      uVar15 = uVar15 & 0xfffffffd;
    }
  }
  (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._options = 0;
  (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._inlineComment = (char *)0x0;
  this_00 = &(this->super_CodeCompiler).super_CodeBuilder._cbHeap;
  pZVar3 = (this->super_CodeCompiler).super_CodeBuilder._cbHeap._zone;
  if (instId - 0x113 < 0x20 || instId - 0x176 < 3) {
    if (pZVar3 == (Zone *)0x0) {
LAB_0015ef30:
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/x86/../x86/../base/../base/../base/../base/../base/zone.h"
                 ,0x183,"isInitialized()");
    }
    node = (CBNode *)ZoneHeap::_alloc(this_00,(ulong)(uVar7 * 0x10 + 0x58),(size_t *)&sb);
    if (node != (CBNode *)0x0) {
      ppCVar1 = &node[2]._next;
      if (uVar7 != 0) {
        aVar5 = (o0->field_0)._mem.field_2;
        *ppCVar1 = (CBNode *)(o0->field_0)._packed[0];
        *(anon_union_8_2_78723da6_for_MemData_2 *)&node[2]._type = aVar5;
        if (uVar7 != 1) {
          aVar5 = (o1->field_0)._mem.field_2;
          node[2]._inlineComment = (char *)(o1->field_0)._packed[0];
          node[2]._passData = (void *)aVar5;
          if (2 < uVar7) {
            aVar5 = (o2->field_0)._mem.field_2;
            node[3]._prev = (CBNode *)(o2->field_0)._packed[0];
            node[3]._next = (CBNode *)aVar5;
            if (uVar7 != 3) {
              aVar5 = (o3->field_0)._mem.field_2;
              *(UInt64 *)&node[3]._type = (o3->field_0)._packed[0];
              node[3]._inlineComment = (char *)aVar5;
              if (4 < uVar7) {
                aVar5 = (o4->field_0)._mem.field_2;
                node[3]._passData = (void *)(o4->field_0)._packed[0];
                node[4]._prev = (CBNode *)aVar5;
                if (uVar7 != 5) {
                  aVar5 = (o5->field_0)._mem.field_2;
                  node[4]._next = (CBNode *)(o5->field_0)._packed[0];
                  *(anon_union_8_2_78723da6_for_MemData_2 *)&node[4]._type = aVar5;
                }
              }
            }
          }
        }
      }
      node->_prev = (CBNode *)0x0;
      node->_next = (CBNode *)0x0;
      node->_type = '\x01';
      uVar6 = (ushort)(this->super_CodeCompiler).super_CodeBuilder._nodeFlags | 4;
      node->_position = (this->super_CodeCompiler).super_CodeBuilder._position;
      *(undefined1 (*) [32])&node->_inlineComment = ZEXT432(0) << 0x40;
      node->_flags = uVar6;
      *(uint32_t *)&node[1]._prev = instId;
      *(uint *)((long)&node[1]._prev + 4) = uVar15;
      node->_opCount = (uint8_t)uVar13;
      node[1]._inlineComment = (char *)ppCVar1;
      ppCVar14 = ppCVar1;
      for (uVar12 = 0; uVar13 != uVar12; uVar12 = uVar12 + 1) {
        if (((ulong)*ppCVar14 & 7) == 2) goto LAB_0015ecde;
        ppCVar14 = ppCVar14 + 2;
      }
      uVar12 = 0xff;
LAB_0015ecde:
      node[1]._type = (uint8_t)uVar12;
      *(undefined1 (*) [16])&node[1]._passData = ZEXT416(0) << 0x20;
      node[1]._next =
           (CBNode *)(this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg;
      (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg._signature = 0;
      (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg._id = 0;
      sb.super_StringBuilder._data = (char *)0x0;
      if ((uVar15 & 0x10) == 0) {
        if (((ulong)*ppCVar1 & 7) == 4) {
          EVar8 = CodeBuilder::getCBLabel
                            ((CodeBuilder *)this,(CBLabel **)&sb,
                             *(uint32_t *)((long)&node[2]._next + 4));
          if (EVar8 != 0) goto LAB_0015ed30;
          uVar6 = node->_flags;
        }
        else {
          uVar15 = uVar15 | 0x10;
        }
      }
      *(uint *)((long)&node[1]._prev + 4) = uVar15;
      uVar4 = 0x50;
      if (instId != 0x11e) {
        uVar4 = 0x20;
      }
      node->_flags = uVar6 | uVar4;
      node[1]._passData = sb.super_StringBuilder._data;
      node[2]._prev = (CBNode *)0x0;
      if (sb.super_StringBuilder._data != (char *)0x0) {
        node[2]._prev = *(CBNode **)(sb.super_StringBuilder._data + 0x30);
        *(CBNode **)(sb.super_StringBuilder._data + 0x30) = node;
        *(int *)(sb.super_StringBuilder._data + 0x2c) =
             *(int *)(sb.super_StringBuilder._data + 0x2c) + 1;
      }
      if ((instId == 0x11e) || ((uVar15 & 0x100) != 0)) {
        node->_flags = uVar6 | uVar4 | 0x40;
      }
LAB_0015edb1:
      if (pcVar11 != (char *)0x0) {
        strlen(pcVar11);
        iVar9 = Zone::dup(&(this->super_CodeCompiler).super_CodeBuilder._cbDataZone,(int)pcVar11);
        node->_inlineComment = (char *)CONCAT44(extraout_var,iVar9);
      }
      CodeBuilder::addNode((CodeBuilder *)this,node);
      return 0;
    }
  }
  else {
    if (pZVar3 == (Zone *)0x0) goto LAB_0015ef30;
    node = (CBNode *)ZoneHeap::_alloc(this_00,(ulong)(uVar7 * 0x10 + 0x48),(size_t *)&sb);
    if (node != (CBNode *)0x0) {
      ppvVar10 = &node[1]._passData;
      if (uVar7 != 0) {
        aVar5 = (o0->field_0)._mem.field_2;
        *ppvVar10 = (void *)(o0->field_0)._packed[0];
        node[2]._prev = (CBNode *)aVar5;
        if (uVar7 != 1) {
          aVar5 = (o1->field_0)._mem.field_2;
          node[2]._next = (CBNode *)(o1->field_0)._packed[0];
          *(anon_union_8_2_78723da6_for_MemData_2 *)&node[2]._type = aVar5;
          if (2 < uVar7) {
            aVar5 = (o2->field_0)._mem.field_2;
            node[2]._inlineComment = (char *)(o2->field_0)._packed[0];
            node[2]._passData = (void *)aVar5;
            if (uVar7 != 3) {
              aVar5 = (o3->field_0)._mem.field_2;
              node[3]._prev = (CBNode *)(o3->field_0)._packed[0];
              node[3]._next = (CBNode *)aVar5;
              if (4 < uVar7) {
                aVar5 = (o4->field_0)._mem.field_2;
                *(UInt64 *)&node[3]._type = (o4->field_0)._packed[0];
                node[3]._inlineComment = (char *)aVar5;
                if (uVar7 != 5) {
                  aVar5 = (o5->field_0)._mem.field_2;
                  node[3]._passData = (void *)(o5->field_0)._packed[0];
                  node[4]._prev = (CBNode *)aVar5;
                }
              }
            }
          }
        }
      }
      node->_prev = (CBNode *)0x0;
      node->_next = (CBNode *)0x0;
      node->_type = '\x01';
      uVar2 = (this->super_CodeCompiler).super_CodeBuilder._nodeFlags;
      node->_position = (this->super_CodeCompiler).super_CodeBuilder._position;
      *(undefined1 (*) [32])&node->_inlineComment = ZEXT432(0) << 0x40;
      node->_flags = (ushort)uVar2 | 4;
      *(uint32_t *)&node[1]._prev = instId & 0xffff;
      *(uint *)((long)&node[1]._prev + 4) = uVar15;
      node->_opCount = (uint8_t)uVar13;
      node[1]._inlineComment = (char *)ppvVar10;
      for (uVar12 = 0; uVar13 != uVar12; uVar12 = uVar12 + 1) {
        if (((ulong)*ppvVar10 & 7) == 2) goto LAB_0015ed41;
        ppvVar10 = ppvVar10 + 2;
      }
      uVar12 = 0xff;
LAB_0015ed41:
      node[1]._type = (uint8_t)uVar12;
      node[1]._next =
           (CBNode *)(this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg;
      (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg._signature = 0;
      (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg._id = 0;
      goto LAB_0015edb1;
    }
  }
  EVar8 = 1;
LAB_0015ed30:
  EVar8 = CodeEmitter::setLastError((CodeEmitter *)this,EVar8,(char *)0x0);
  return EVar8;
}

Assistant:

Error X86Compiler::_emit(uint32_t instId, const Operand_& o0, const Operand_& o1, const Operand_& o2, const Operand_& o3, const Operand_& o4, const Operand_& o5) {
  uint32_t options = getOptions() | getGlobalOptions();
  const char* inlineComment = getInlineComment();

  uint32_t opCount = static_cast<uint32_t>(!o0.isNone()) +
                     static_cast<uint32_t>(!o1.isNone()) +
                     static_cast<uint32_t>(!o2.isNone()) +
                     static_cast<uint32_t>(!o3.isNone()) ;

  // Count 5th and 6th operands.
  if (!o4.isNone()) opCount = 5;
  if (!o5.isNone()) opCount = 6;

  // Handle failure and rare cases first.
  const uint32_t kErrorsAndSpecialCases = kOptionMaybeFailureCase | // CodeEmitter in error state.
                                          kOptionStrictValidation ; // Strict validation.

  if (ASMJIT_UNLIKELY(options & kErrorsAndSpecialCases)) {
    // Don't do anything if we are in error state.
    if (_lastError) return _lastError;

#if !defined(ASMJIT_DISABLE_VALIDATION)
    // Strict validation.
    if (options & kOptionStrictValidation) {
      Operand opArray[] = {
        Operand(o0),
        Operand(o1),
        Operand(o2),
        Operand(o3),
        Operand(o4),
        Operand(o5)
      };

      Inst::Detail instDetail(instId, options, _extraReg);
      Error err = Inst::validate(getArchType(), instDetail, opArray, opCount);

      if (err) {
#if !defined(ASMJIT_DISABLE_LOGGING)
        StringBuilderTmp<256> sb;
        sb.appendString(DebugUtils::errorAsString(err));
        sb.appendString(": ");
        Logging::formatInstruction(sb, 0, this, getArchType(), instDetail, opArray, opCount);
        return setLastError(err, sb.getData());
#else
        return setLastError(err);
#endif
      }

      // Clear it as it must be enabled explicitly on assembler side.
      options &= ~kOptionStrictValidation;
    }
#endif // ASMJIT_DISABLE_VALIDATION
  }

  resetOptions();
  resetInlineComment();

  // decide between `CBInst` and `CBJump`.
  if (isJumpInst(instId)) {
    CBJump* node = _cbHeap.allocT<CBJump>(sizeof(CBJump) + opCount * sizeof(Operand));
    Operand* opArray = reinterpret_cast<Operand*>(reinterpret_cast<uint8_t*>(node) + sizeof(CBJump));

    if (ASMJIT_UNLIKELY(!node))
      return setLastError(DebugUtils::errored(kErrorNoHeapMemory));

    if (opCount > 0) opArray[0].copyFrom(o0);
    if (opCount > 1) opArray[1].copyFrom(o1);
    if (opCount > 2) opArray[2].copyFrom(o2);
    if (opCount > 3) opArray[3].copyFrom(o3);
    if (opCount > 4) opArray[4].copyFrom(o4);
    if (opCount > 5) opArray[5].copyFrom(o5);

    new(node) CBJump(this, instId, options, opArray, opCount);
    node->_instDetail.extraReg = _extraReg;
    _extraReg.reset();

    CBLabel* jTarget = nullptr;
    if (!(options & kOptionUnfollow)) {
      if (opArray[0].isLabel()) {
        Error err = getCBLabel(&jTarget, static_cast<Label&>(opArray[0]));
        if (err) return setLastError(err);
      }
      else {
        options |= kOptionUnfollow;
      }
    }
    node->setOptions(options);

    node->orFlags(instId == X86Inst::kIdJmp ? CBNode::kFlagIsJmp | CBNode::kFlagIsTaken : CBNode::kFlagIsJcc);
    node->_target = jTarget;
    node->_jumpNext = nullptr;

    if (jTarget) {
      node->_jumpNext = static_cast<CBJump*>(jTarget->_from);
      jTarget->_from = node;
      jTarget->addNumRefs();
    }

    // The 'jmp' is always taken, conditional jump can contain hint, we detect it.
    if (instId == X86Inst::kIdJmp)
      node->orFlags(CBNode::kFlagIsTaken);
    else if (options & X86Inst::kOptionTaken)
      node->orFlags(CBNode::kFlagIsTaken);

    if (inlineComment) {
      inlineComment = static_cast<char*>(_cbDataZone.dup(inlineComment, ::strlen(inlineComment), true));
      node->setInlineComment(inlineComment);
    }

    addNode(node);
    return kErrorOk;
  }
  else {
    CBInst* node = _cbHeap.allocT<CBInst>(sizeof(CBInst) + opCount * sizeof(Operand));
    Operand* opArray = reinterpret_cast<Operand*>(reinterpret_cast<uint8_t*>(node) + sizeof(CBInst));

    if (ASMJIT_UNLIKELY(!node))
      return setLastError(DebugUtils::errored(kErrorNoHeapMemory));

    if (opCount > 0) opArray[0].copyFrom(o0);
    if (opCount > 1) opArray[1].copyFrom(o1);
    if (opCount > 2) opArray[2].copyFrom(o2);
    if (opCount > 3) opArray[3].copyFrom(o3);
    if (opCount > 4) opArray[4].copyFrom(o4);
    if (opCount > 5) opArray[5].copyFrom(o5);

    node = new(node) CBInst(this, instId, options, opArray, opCount);
    node->_instDetail.extraReg = _extraReg;
    _extraReg.reset();

    if (inlineComment) {
      inlineComment = static_cast<char*>(_cbDataZone.dup(inlineComment, ::strlen(inlineComment), true));
      node->setInlineComment(inlineComment);
    }

    addNode(node);
    return kErrorOk;
  }
}